

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O2

ErrorCode Escape::loadGraph(char *path,Graph *graph,int undirected,IOFormat fmt)

{
  VertexIdx *pVVar1;
  char cVar2;
  int iVar3;
  ErrorCode EVar4;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  VertexIdx *pVVar7;
  long lVar8;
  long local_450;
  int64_t i1;
  ulong local_440;
  char line [1024];
  
  if (fmt == escape) {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"could not open file %s\n",path);
      EVar4 = ecInvalidInput;
    }
    else {
      graph->nVertices = 0;
      local_440 = (ulong)(undirected != 0);
      lVar8 = 0;
LAB_0010c1ea:
      pcVar5 = fgets(line,0x400,__stream);
      if (pcVar5 != (char *)0x0) {
        cVar2 = line[0];
        pcVar5 = line;
        if (line[0] != '#') {
          while (pcVar5 = pcVar5 + 1, cVar2 != '\0') {
            iVar3 = isspace((int)cVar2);
            if (iVar3 == 0) {
              __isoc99_sscanf(line,"%lld%lld",&i1,&local_450);
              if (graph->nVertices == 0) {
                graph->nVertices = i1;
                uVar6 = local_450 << ((byte)local_440 & 0x3f);
                graph->nEdges = uVar6;
                uVar6 = -(ulong)(uVar6 >> 0x3d != 0) | uVar6 << 3;
                pVVar7 = (VertexIdx *)operator_new__(uVar6);
                graph->srcs = pVVar7;
                pVVar7 = (VertexIdx *)operator_new__(uVar6);
                graph->dsts = pVVar7;
              }
              else {
                pVVar7 = graph->srcs;
                pVVar7[lVar8] = i1;
                pVVar1 = graph->dsts;
                pVVar1[lVar8] = local_450;
                if (undirected == 0) {
                  lVar8 = lVar8 + 1;
                }
                else {
                  pVVar7[lVar8 + 1] = local_450;
                  pVVar1[lVar8 + 1] = i1;
                  lVar8 = lVar8 + 2;
                }
              }
              break;
            }
            cVar2 = *pcVar5;
          }
        }
        goto LAB_0010c1ea;
      }
      fclose(__stream);
      EVar4 = ecNone;
      if (lVar8 < graph->nEdges) {
        fprintf(_stderr,"expected %lld edges, only got %lld\n",graph->nEdges,lVar8);
        EVar4 = ecIOError;
      }
    }
  }
  else {
    EVar4 = ecUnsupportedFormat;
  }
  return EVar4;
}

Assistant:

ErrorCode Escape::loadGraph(const char *path, Graph &graph, int undirected, IOFormat fmt) {
    switch (fmt) {
        case IOFormat::escape:
            return loadGraph_Escape(path, graph, undirected);
        default:
            return ecUnsupportedFormat;
    }
}